

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O0

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  SQChar SVar1;
  SQInteger SVar2;
  int iVar3;
  long lVar4;
  SQRESULT SVar5;
  size_t sVar6;
  char *local_d8;
  SQChar *prec;
  long lStack_c8;
  SQChar f;
  SQInteger fpos;
  size_t flen;
  undefined8 uStack_b0;
  SQFloat tf;
  SQInteger ti;
  SQChar *ts;
  SQInteger valtype;
  SQInteger addlen;
  SQInteger w;
  SQInteger nparam;
  SQInteger i;
  SQInteger n;
  SQInteger allocated;
  SQInteger format_size;
  SQRESULT res;
  SQChar fmt [20];
  SQChar *dest;
  SQChar *format;
  SQChar **output_local;
  SQInteger *outlen_local;
  SQInteger nformatstringidx_local;
  HSQUIRRELVM v_local;
  
  format = (SQChar *)output;
  output_local = (SQChar **)outlen;
  outlen_local = (SQInteger *)nformatstringidx;
  nformatstringidx_local = (SQInteger)v;
  format_size = sq_getstring(v,nformatstringidx,&dest);
  v_local = (HSQUIRRELVM)format_size;
  if (-1 < format_size) {
    allocated = sq_getsize(nformatstringidx_local,outlen_local);
    n = allocated + 2;
    register0x00000000 = sq_getscratchpad(nformatstringidx_local,n);
    i = 0;
    nparam = 0;
    w = (long)outlen_local + 1;
    addlen = 0;
    while (SVar2 = w, i < allocated) {
      if (dest[i] == '%') {
        if (dest[i + 1] == '%') {
          *(undefined1 *)(stack0xffffffffffffffc0 + nparam) = 0x25;
          i = i + 2;
          nparam = nparam + 1;
        }
        else {
          i = i + 1;
          lVar4 = sq_gettop(nformatstringidx_local);
          if (lVar4 < SVar2) {
            SVar5 = sq_throwerror(nformatstringidx_local,
                                  "not enough parameters for the given format string");
            return SVar5;
          }
          i = validate_format((HSQUIRRELVM)nformatstringidx_local,(SQChar *)&res,dest,i,&addlen);
          if (i < 0) {
            return -1;
          }
          valtype = 0;
          ts = (SQChar *)0x0;
          ti = 0;
          uStack_b0 = 0;
          flen._4_4_ = 0.0;
          switch(dest[i]) {
          case 'E':
          case 'G':
          case 'e':
          case 'f':
          case 'g':
            lVar4 = sq_getfloat(nformatstringidx_local,w,(long)&flen + 4);
            if (lVar4 < 0) {
              SVar5 = sq_throwerror(nformatstringidx_local,"float expected for the specified format"
                                   );
              return SVar5;
            }
            valtype = addlen + 0x65;
            ts = (SQChar *)0x66;
            break;
          default:
            SVar5 = sq_throwerror(nformatstringidx_local,"invalid format");
            return SVar5;
          case 'X':
          case 'd':
          case 'i':
          case 'o':
          case 'u':
          case 'x':
            sVar6 = strlen((char *)&res);
            SVar1 = *(SQChar *)((long)&format_size + sVar6 + 7);
            local_d8 = "ll";
            lStack_c8 = sVar6 - 1;
            while (*local_d8 != '\0') {
              fmt[lStack_c8 + -8] = *local_d8;
              local_d8 = local_d8 + 1;
              lStack_c8 = lStack_c8 + 1;
            }
            fmt[lStack_c8 + -8] = SVar1;
            fmt[lStack_c8 + -7] = '\0';
          case 'c':
            lVar4 = sq_getinteger(nformatstringidx_local,w,&stack0xffffffffffffff50);
            if (lVar4 < 0) {
              SVar5 = sq_throwerror(nformatstringidx_local,
                                    "integer expected for the specified format");
              return SVar5;
            }
            valtype = addlen + 0x65;
            ts = (SQChar *)0x69;
            break;
          case 's':
            lVar4 = sq_getstring(nformatstringidx_local,w,&ti);
            if (lVar4 < 0) {
              SVar5 = sq_throwerror(nformatstringidx_local,
                                    "string expected for the specified format");
              return SVar5;
            }
            lVar4 = sq_getsize(nformatstringidx_local,w);
            valtype = lVar4 + addlen + 1;
            ts = (SQChar *)0x73;
          }
          i = i + 1;
          n = valtype + 1 + n;
          register0x00000000 = sq_getscratchpad(nformatstringidx_local,n);
          if (ts == (SQChar *)0x66) {
            iVar3 = snprintf((char *)(register0x00000000 + nparam),n,(char *)&res,(double)flen._4_4_
                            );
            nparam = iVar3 + nparam;
          }
          else if (ts == (SQChar *)0x69) {
            iVar3 = snprintf((char *)(register0x00000000 + nparam),n,(char *)&res,uStack_b0);
            nparam = iVar3 + nparam;
          }
          else if (ts == (SQChar *)0x73) {
            iVar3 = snprintf((char *)(register0x00000000 + nparam),n,(char *)&res,ti);
            nparam = iVar3 + nparam;
          }
          w = w + 1;
        }
      }
      else {
        if (n <= nparam) {
          __assert_fail("i < allocated",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/sqstdlib/sqstdstring.cpp"
                        ,0x54,
                        "SQRESULT sqstd_format(HSQUIRRELVM, SQInteger, SQInteger *, SQChar **)");
        }
        *(SQChar *)(stack0xffffffffffffffc0 + nparam) = dest[i];
        i = i + 1;
        nparam = nparam + 1;
      }
    }
    *output_local = (SQChar *)nparam;
    *(undefined1 *)(stack0xffffffffffffffc0 + nparam) = 0;
    *(long *)format = stack0xffffffffffffffc0;
    v_local = (HSQUIRRELVM)0x0;
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    const SQRESULT res = sq_getstring(v,nformatstringidx,&format);
    if (SQ_FAILED(res)) {
        return res; // propagate the error
    }
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = scstrlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': i += scsprintf(&dest[i],allocated,fmt,tf); break;
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}